

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

QualifiedColumnName * duckdb::QualifiedColumnName::Deserialize(Deserializer *deserializer)

{
  QualifiedColumnName *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  char *in_stack_00000010;
  field_id_t in_stack_0000001e;
  Deserializer *in_stack_00000020;
  QualifiedColumnName *result;
  
  QualifiedColumnName(in_RDI);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_00000020,in_stack_0000001e,in_stack_00000010,in_stack_00000008);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_00000020,in_stack_0000001e,in_stack_00000010,in_stack_00000008);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_00000020,in_stack_0000001e,in_stack_00000010,in_stack_00000008);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_00000020,in_stack_0000001e,in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

QualifiedColumnName QualifiedColumnName::Deserialize(Deserializer &deserializer) {
	QualifiedColumnName result;
	deserializer.ReadPropertyWithDefault<string>(100, "catalog", result.catalog);
	deserializer.ReadPropertyWithDefault<string>(101, "schema", result.schema);
	deserializer.ReadPropertyWithDefault<string>(102, "table", result.table);
	deserializer.ReadPropertyWithDefault<string>(103, "column", result.column);
	return result;
}